

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

size_t __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::eraseAllImpl<kj::_::IterRange<kj::_::BTreeImpl::Iterator>&>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,IterRange<kj::_::BTreeImpl::Iterator> *collection)

{
  uint uVar1;
  Leaf *pLVar2;
  RemoveConst<unsigned_long> *pRVar3;
  long lVar4;
  size_t *psVar5;
  Vector<unsigned_long> erased;
  Iterator __begin0;
  ulong local_70;
  ArrayBuilder<unsigned_long> local_68;
  Iterator local_48;
  
  local_68.endPtr = (unsigned_long *)0x0;
  local_68.ptr = (size_t *)0x0;
  local_68.pos = (size_t *)0x0;
  local_68.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_48._16_8_ = *(undefined8 *)&(collection->b).row;
  local_48.tree = (collection->b).tree;
  local_48.leaf = (collection->b).leaf;
  pLVar2 = (collection->e).leaf;
  uVar1 = (collection->e).row;
  while( true ) {
    pRVar3 = local_68.pos;
    if ((local_48.leaf == pLVar2) && (psVar5 = local_68.ptr, local_48.row == uVar1)) break;
    for (local_70 = (ulong)((local_48.leaf)->rows[local_48._16_8_ & 0xffffffff].i - 1);
        (ulong)((*(long *)(this + 8) - *(long *)this >> 5) -
               ((long)local_68.pos - (long)local_68.ptr >> 3)) <= local_70;
        local_70 = *(ulong *)((long)local_68.ptr +
                             ~local_70 * 8 + (*(long *)(this + 8) - *(long *)this >> 2))) {
    }
    Vector<unsigned_long>::add<unsigned_long&>((Vector<unsigned_long> *)&local_68,&local_70);
    _::BTreeImpl::Iterator::operator++(&local_48);
  }
  for (; psVar5 != pRVar3; psVar5 = psVar5 + 1) {
    Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
    ::eraseImpl((Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
                 *)this,*psVar5);
  }
  lVar4 = (long)local_68.pos - (long)local_68.ptr;
  ArrayBuilder<unsigned_long>::dispose(&local_68);
  return lVar4 >> 3;
}

Assistant:

size_t Table<Row, Indexes...>::eraseAllImpl(Collection&& collection) {
  // We need to transform the collection of row numbers into a sequence of erasures, accounting
  // for the fact that each erasure re-positions the last row into its slot.
  Vector<size_t> erased;
  _::tryReserveSize(erased, collection);
  for (size_t pos: collection) {
    while (pos >= rows.size() - erased.size()) {
      // Oops, the next item to be erased is already scheduled to be moved to a different location
      // due to a previous erasure. Figure out where it will be at this point.
      size_t erasureNumber = rows.size() - pos - 1;
      pos = erased[erasureNumber];
    }
    erased.add(pos);
  }

  // Now we can execute the sequence of erasures.
  for (size_t pos: erased) {
    eraseImpl(pos);
  }

  return erased.size();
}